

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCrypto_openssl.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_735e60::RC4Loader::RC4Loader(RC4Loader *this)

{
  OSSL_LIB_CTX *pOVar1;
  runtime_error *prVar2;
  OSSL_PROVIDER *pOVar3;
  EVP_CIPHER *pEVar4;
  RC4Loader *this_local;
  
  pOVar1 = (OSSL_LIB_CTX *)OSSL_LIB_CTX_new();
  this->libctx = pOVar1;
  if (this->libctx == (OSSL_LIB_CTX *)0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"unable to create openssl library context");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pOVar3 = (OSSL_PROVIDER *)OSSL_PROVIDER_load(this->libctx,"legacy");
  this->legacy = pOVar3;
  if (this->legacy == (OSSL_PROVIDER *)0x0) {
    OSSL_LIB_CTX_free(this->libctx);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"unable to load openssl legacy provider");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pEVar4 = (EVP_CIPHER *)EVP_CIPHER_fetch(this->libctx,"RC4",0);
  this->rc4 = pEVar4;
  if (this->rc4 == (EVP_CIPHER *)0x0) {
    OSSL_PROVIDER_unload(this->legacy);
    OSSL_LIB_CTX_free(this->libctx);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"unable to load openssl rc4 algorithm");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

RC4Loader::RC4Loader()
{
    libctx = OSSL_LIB_CTX_new();
    if (libctx == nullptr) {
        throw std::runtime_error("unable to create openssl library context");
        return;
    }
    legacy = OSSL_PROVIDER_load(libctx, "legacy");
    if (legacy == nullptr) {
        OSSL_LIB_CTX_free(libctx);
        throw std::runtime_error("unable to load openssl legacy provider");
        return;
    }
    rc4 = EVP_CIPHER_fetch(libctx, "RC4", nullptr);
    if (rc4 == nullptr) {
        OSSL_PROVIDER_unload(legacy);
        OSSL_LIB_CTX_free(libctx);
        throw std::runtime_error("unable to load openssl rc4 algorithm");
        return;
    }
}